

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

Dict * tagsLookup(TidyDocImpl *doc,TidyTagImpl *tags,ctmbstr s)

{
  DictHash *pDVar1;
  uint uVar2;
  int iVar3;
  DictHash **ppDVar4;
  Dict **ppDVar5;
  Dict *old;
  
  if (s == (ctmbstr)0x0) {
    return (Dict *)0x0;
  }
  uVar2 = tagsHash(s);
  ppDVar4 = tags->hashtab + uVar2;
  while ((pDVar1 = *ppDVar4, pDVar1 != (DictHash *)0x0 && (pDVar1->tag != (Dict *)0x0))) {
    iVar3 = prvTidytmbstrcmp(s,pDVar1->tag->name);
    if (iVar3 == 0) {
      return pDVar1->tag;
    }
    ppDVar4 = &pDVar1->next;
  }
  old = tag_defs;
  while (old = old + 1, old < tag_defs + 0x99) {
    iVar3 = prvTidytmbstrcmp(s,old->name);
    if (iVar3 == 0) goto LAB_001440ba;
  }
  ppDVar5 = &tags->declared_tag_list;
  while( true ) {
    old = *ppDVar5;
    if (old == (Dict *)0x0) {
      return (Dict *)0x0;
    }
    iVar3 = prvTidytmbstrcmp(s,old->name);
    if (iVar3 == 0) break;
    ppDVar5 = &old->next;
  }
LAB_001440ba:
  tagsInstall(doc,tags,old);
  return old;
}

Assistant:

static const Dict* tagsLookup( TidyDocImpl* doc, TidyTagImpl* tags, ctmbstr s )
{
    const Dict *np;
    const DictHash* p;

    if (!s)
        return NULL;

    /* this breaks if declared elements get changed between two   */
    /* parser runs since Tidy would use the cached version rather */
    /* than the new one.                                          */
    /* However, as FreeDeclaredTags() correctly cleans the hash   */
    /* this should not be true anymore.                           */
    for (p = tags->hashtab[tagsHash(s)]; p && p->tag; p = p->next)
        if (TY_(tmbstrcmp)(s, p->tag->name) == 0)
            return p->tag;

    for (np = tag_defs + 1; np < tag_defs + N_TIDY_TAGS; ++np)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    for (np = tags->declared_tag_list; np; np = np->next)
        if (TY_(tmbstrcmp)(s, np->name) == 0)
            return tagsInstall(doc, tags, np);

    return NULL;
}